

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_round3(uint16_t *out,uint16_t *in,uint p,uint q)

{
  uint16_t uVar1;
  ulong uVar2;
  
  ntru_mod3(out,in,p,q);
  for (uVar2 = 0; p != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = reduce((uint)in[uVar2] + (q >> 1),(ushort)q,
                   SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT216((ushort)q),0));
    out[uVar2] = uVar1 - (out[uVar2] + (short)(q >> 1));
  }
  return;
}

Assistant:

void ntru_round3(uint16_t *out, const uint16_t *in, unsigned p, unsigned q)
{
    SETUP;
    unsigned bias = q/2;
    ntru_mod3(out, in, p, q);
    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(in[i] + bias) - bias - out[i];
}